

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O3

void __thiscall
Assimp::FBX::FBXConverter::ConvertNodes
          (FBXConverter *this,uint64_t id,aiNode *parent,aiMatrix4x4 *parent_transform)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  bool bVar15;
  Object *pOVar16;
  Model *pMVar17;
  aiNode *this_00;
  aiNode **ppaVar18;
  long lVar19;
  aiNode **ppaVar20;
  aiNode *paVar21;
  aiNode *paVar22;
  undefined1 auVar23 [8];
  ulong uVar24;
  pointer ppCVar25;
  pointer ppaVar26;
  ulong __n;
  pointer ppCVar27;
  pointer ppaVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  vector<aiNode_*,_std::allocator<aiNode_*>_> nodes_chain;
  vector<aiNode_*,_std::allocator<aiNode_*>_> post_nodes_chain;
  vector<aiNode_*,_std::allocator<aiNode_*>_> nodes;
  string unique_name;
  undefined1 local_228 [8];
  aiNode **ppaStack_220;
  aiNode **local_218;
  aiMatrix4x4 local_208;
  Model *local_1c0;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  vector<aiNode_*,_std::allocator<aiNode_*>_> local_1a8;
  aiNode *local_190;
  vector<aiNode_*,_std::allocator<aiNode_*>_> local_188;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  local_130;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  pointer local_90;
  aiMatrix4x4 *local_88;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_> local_80
  ;
  string local_68;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_190 = (aiNode *)this;
  local_88 = parent_transform;
  Document::GetConnectionsByDestinationSequenced(&local_80,this->doc,id,"Model");
  local_188.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (aiNode **)0x0;
  local_188.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (aiNode **)0x0;
  local_188.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (aiNode **)0x0;
  std::vector<aiNode_*,_std::allocator<aiNode_*>_>::reserve
            (&local_188,
             (long)local_80.
                   super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_80.
                   super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  local_228 = (undefined1  [8])0x0;
  ppaStack_220 = (aiNode **)0x0;
  local_218 = (aiNode **)0x0;
  local_1a8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1a8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1a8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if (local_80.
      super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_80.
      super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_90 = local_80.
               super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    paVar21 = local_190;
    ppCVar25 = local_80.
               super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    ppCVar27 = local_80.
               super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (((*ppCVar27)->prop)._M_string_length == 0) {
        pOVar16 = Connection::SourceObject(*ppCVar27);
        if (pOVar16 == (Object *)0x0) {
          LogFunctions<Assimp::FBXImporter>::LogWarn((char *)0x16cb8a);
        }
        else {
          pMVar17 = (Model *)__dynamic_cast(pOVar16,&Object::typeinfo,&Model::typeinfo,0);
          local_1c0 = pMVar17;
          if (pMVar17 != (Model *)0x0) {
            if ((undefined1  [8])ppaStack_220 != local_228) {
              ppaStack_220 = (aiNode **)local_228;
            }
            if (local_1a8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_1a8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                super__Vector_impl_data._M_start) {
              local_1a8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_1a8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
            }
            uVar7 = local_88->a1;
            uVar8 = local_88->a2;
            uVar9 = local_88->a3;
            uVar10 = local_88->a4;
            uVar11 = local_88->b1;
            uVar12 = local_88->b2;
            uVar13 = local_88->b3;
            uVar14 = local_88->b4;
            local_208.c1 = local_88->c1;
            local_208.c2 = local_88->c2;
            local_208.c3 = local_88->c3;
            local_208.c4 = local_88->c4;
            local_208.d1 = local_88->d1;
            local_208.d2 = local_88->d2;
            local_208.d3 = local_88->d3;
            local_208.d4 = local_88->d4;
            local_208.a1 = (float)uVar7;
            local_208.a2 = (float)uVar8;
            local_208.a3 = (float)uVar9;
            local_208.a4 = (float)uVar10;
            local_208.b1 = (float)uVar11;
            local_208.b2 = (float)uVar12;
            local_208.b3 = (float)uVar13;
            local_208.b4 = (float)uVar14;
            MakeUniqueNodeName_abi_cxx11_(&local_68,(FBXConverter *)paVar21,pMVar17,parent);
            paVar22 = paVar21;
            bVar15 = GenerateTransformationNodeChain
                               ((FBXConverter *)paVar21,pMVar17,&local_68,
                                (vector<aiNode_*,_std::allocator<aiNode_*>_> *)local_228,&local_1a8)
            ;
            if ((undefined1  [8])ppaStack_220 == local_228) {
              __assert_fail("nodes_chain.size()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                            ,0xde,
                            "void Assimp::FBX::FBXConverter::ConvertNodes(uint64_t, aiNode &, const aiMatrix4x4 &)"
                           );
            }
            if (bVar15) {
              this_00 = (aiNode *)operator_new(0x478);
              paVar22 = this_00;
              aiNode::aiNode(this_00,&local_68);
              local_130.
              super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)this_00;
              if (ppaStack_220 == local_218) {
                paVar22 = (aiNode *)local_228;
                std::vector<aiNode*,std::allocator<aiNode*>>::_M_realloc_insert<aiNode*>
                          ((vector<aiNode*,std::allocator<aiNode*>> *)local_228,
                           (iterator)ppaStack_220,(aiNode **)&local_130);
              }
              else {
                *ppaStack_220 = this_00;
                ppaStack_220 = ppaStack_220 + 1;
              }
            }
            SetupNodeMetadata((FBXConverter *)paVar22,local_1c0,ppaStack_220[-1]);
            ppaVar20 = ppaStack_220;
            fVar36 = 0.0;
            fVar37 = 0.0;
            fVar38 = 0.0;
            paVar22 = parent;
            if (local_228 != (undefined1  [8])ppaStack_220) {
              fVar42 = 0.0;
              fVar50 = 0.0;
              fVar51 = 0.0;
              paVar21 = parent;
              auVar23 = local_228;
              fVar43 = local_208.a1;
              fStack_15c = local_208.b1;
              fVar41 = 0.0;
              local_168 = local_208.a2;
              fVar29 = local_208.a4;
              fVar49 = local_208.b1;
              fVar48 = local_208.b2;
              fStack_160 = local_208.a4;
              fVar60 = local_208.b4;
              fVar46 = local_208.b2;
              fVar47 = local_208.b3;
              fVar33 = local_208.c4;
              fVar39 = local_208.d4;
              fVar55 = local_208.d3;
              fStack_164 = local_208.a3;
              fVar56 = local_208.b3;
              fVar54 = local_208.b1;
              fVar53 = local_208.b2;
              fVar59 = local_208.c3;
              fVar32 = local_208.d3;
              fVar62 = local_208.d1;
              fVar63 = local_208.d2;
              fVar57 = local_208.c1;
              fVar30 = local_208.d1;
              fVar58 = local_208.c3;
              fVar31 = local_208.c4;
              fVar34 = local_208.c2;
              fVar35 = local_208.d2;
              fVar40 = local_208.c4;
              fVar52 = local_208.d1;
              do {
                paVar22 = *(aiNode **)auVar23;
                if (paVar22 == (aiNode *)0x0) {
                  local_208.c2 = fVar34;
                  local_208.c1 = fVar57;
                  local_208.c4 = fVar33;
                  local_208.c3 = fVar59;
                  local_208.d2 = fVar35;
                  local_208.d1 = fVar30;
                  local_208.d4 = fVar39;
                  local_208.d3 = fVar32;
                  local_208.a2 = local_168;
                  local_208.a3 = fStack_164;
                  local_208.a4 = fStack_160;
                  local_208.b1 = fStack_15c;
                  local_208.b2 = fVar48;
                  local_208.b3 = fVar56;
                  local_208.b4 = fVar60;
                  __assert_fail("prenode",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                                ,0xea,
                                "void Assimp::FBX::FBXConverter::ConvertNodes(uint64_t, aiNode &, const aiMatrix4x4 &)"
                               );
                }
                local_1b8 = fStack_160;
                fStack_1b4 = fVar60;
                fVar44 = fVar59;
                fVar45 = fVar57;
                fVar61 = fVar30;
                local_158 = local_168;
                fStack_154 = fVar48;
                fStack_150 = fVar29;
                fStack_14c = fVar49;
                local_148 = fVar43;
                fStack_144 = fStack_15c;
                fStack_140 = fVar41;
                fStack_13c = fVar41;
                if (paVar21 != parent) {
                  paVar21->mNumChildren = 1;
                  fStack_1b0 = fVar46;
                  fStack_1ac = fVar47;
                  local_118 = fVar33;
                  fStack_114 = fVar30;
                  fStack_110 = fVar35;
                  fStack_10c = fVar32;
                  local_108 = fVar39;
                  fStack_104 = fVar42;
                  fStack_100 = fVar42;
                  fStack_fc = fVar42;
                  local_f8 = fVar48;
                  fStack_f4 = fVar56;
                  fStack_f0 = fVar50;
                  fStack_ec = fVar51;
                  local_e8 = fVar34;
                  fStack_e4 = fVar35;
                  fStack_e0 = fVar40;
                  fStack_dc = fVar52;
                  local_d8 = fVar57;
                  fStack_d4 = fVar30;
                  fStack_d0 = fVar58;
                  fStack_cc = fVar31;
                  local_c8 = fVar59;
                  fStack_c4 = fVar32;
                  fStack_c0 = fVar62;
                  fStack_bc = fVar63;
                  local_b8 = fStack_164;
                  fStack_b4 = fVar56;
                  fStack_b0 = fVar54;
                  fStack_ac = fVar53;
                  local_a8 = fVar33;
                  fStack_a4 = fVar39;
                  fStack_a0 = fVar63;
                  fStack_9c = fVar55;
                  local_48 = fVar60;
                  fStack_44 = fVar57;
                  fStack_40 = fVar34;
                  fStack_3c = fVar59;
                  ppaVar18 = (aiNode **)operator_new__(8);
                  paVar21->mChildren = ppaVar18;
                  *ppaVar18 = paVar22;
                  fVar33 = local_a8;
                  fVar39 = fStack_a4;
                  fStack_164 = local_b8;
                  fVar56 = fStack_b4;
                  fVar44 = local_c8;
                  fVar32 = fStack_c4;
                  fVar45 = local_d8;
                  fVar61 = fStack_d4;
                  fVar34 = local_e8;
                  fVar35 = fStack_e4;
                }
                fVar42 = fVar39;
                paVar22->mParent = paVar21;
                fVar52 = (paVar22->mTransformation).a1;
                fVar41 = (paVar22->mTransformation).a2;
                fVar46 = (paVar22->mTransformation).a3;
                fVar47 = (paVar22->mTransformation).a4;
                fVar55 = (paVar22->mTransformation).b1;
                fVar54 = (paVar22->mTransformation).b2;
                fVar53 = (paVar22->mTransformation).b3;
                fVar62 = (paVar22->mTransformation).b4;
                fVar63 = (paVar22->mTransformation).c1;
                fVar31 = (paVar22->mTransformation).c2;
                fVar40 = (paVar22->mTransformation).c3;
                fVar64 = (paVar22->mTransformation).c4;
                fVar30 = (paVar22->mTransformation).d1;
                fVar36 = (paVar22->mTransformation).d2;
                fVar37 = (paVar22->mTransformation).d3;
                fVar38 = (paVar22->mTransformation).d4;
                fVar43 = fVar30 * local_1b8 +
                         fVar63 * fStack_164 + fVar52 * local_148 + fVar55 * local_158;
                fStack_15c = fStack_1b4 * fVar30 +
                             fVar56 * fVar63 + fStack_144 * fVar52 + fStack_154 * fVar55;
                local_168 = local_1b8 * fVar36 +
                            fStack_164 * fVar31 + local_148 * fVar41 + local_158 * fVar54;
                fVar29 = local_1b8 * fVar37 +
                         fStack_164 * fVar40 + local_148 * fVar46 + local_158 * fVar53;
                fStack_160 = local_1b8 * fVar38 +
                             fStack_164 * fVar64 + local_148 * fVar47 + local_158 * fVar62;
                fVar48 = fStack_1b4 * fVar36 +
                         fVar56 * fVar31 + fStack_144 * fVar41 + fStack_154 * fVar54;
                fVar49 = fStack_1b4 * fVar37 +
                         fVar56 * fVar40 + fStack_144 * fVar46 + fStack_154 * fVar53;
                fVar50 = fStack_1b4 * fVar37 +
                         fVar56 * fVar40 + fStack_144 * fVar46 + fStack_154 * fVar53;
                fVar51 = fStack_1b4 * fVar38 +
                         fVar56 * fVar64 + fStack_144 * fVar47 + fStack_154 * fVar62;
                fVar39 = fVar42 * fVar38 + fVar32 * fVar64 + fVar61 * fVar47 + fVar62 * fVar35;
                fVar57 = fVar33 * fVar30 + fVar44 * fVar63 + fVar45 * fVar52 + fVar34 * fVar55;
                fVar58 = fVar33 * fVar36 + fVar44 * fVar31 + fVar45 * fVar41 + fVar34 * fVar54;
                fVar59 = fVar33 * fVar37 + fVar44 * fVar40 + fVar45 * fVar46 + fVar34 * fVar53;
                fVar60 = fStack_1b4 * fVar38 +
                         fVar56 * fVar64 + fStack_144 * fVar47 + fStack_154 * fVar62;
                fVar30 = fVar42 * fVar30 + fVar32 * fVar63 + fVar61 * fVar52 + fVar35 * fVar55;
                fVar31 = fVar42 * fVar36 + fVar32 * fVar31 + fVar61 * fVar41 + fVar35 * fVar54;
                fVar32 = fVar42 * fVar37 + fVar32 * fVar40 + fVar61 * fVar46 + fVar35 * fVar53;
                fVar33 = fVar33 * fVar38 + fVar44 * fVar64 + fVar45 * fVar47 + fVar34 * fVar62;
                auVar23 = (undefined1  [8])((long)auVar23 + 8);
                paVar21 = paVar22;
                fVar41 = fStack_15c;
                fVar46 = fVar29;
                fVar47 = fStack_160;
                fVar55 = fVar33;
                fStack_164 = fVar29;
                fVar56 = fVar49;
                fVar54 = fVar29;
                fVar53 = fStack_160;
                fVar62 = fVar60;
                fVar63 = fVar33;
                fVar34 = fVar58;
                fVar35 = fVar31;
                fVar40 = fVar58;
                fVar52 = fVar58;
                local_1b8 = fVar43;
                fStack_1b4 = fVar36;
                fStack_1b0 = fVar37;
                fStack_1ac = fVar38;
              } while (auVar23 != (undefined1  [8])ppaVar20);
              local_208.c2 = fVar58;
              local_208.c1 = fVar57;
              local_208.c4 = fVar33;
              local_208.c3 = fVar59;
              local_208.d2 = fVar31;
              local_208.d1 = fVar30;
              local_208.d4 = fVar39;
              local_208.d3 = fVar32;
              paVar21 = local_190;
              local_208.a1 = fVar43;
              local_208.a2 = local_168;
              local_208.a3 = fVar29;
              local_208.a4 = fStack_160;
              local_208.b1 = fStack_15c;
              local_208.b2 = fVar48;
              local_208.b3 = fVar49;
              local_208.b4 = fVar60;
            }
            pMVar17 = local_1c0;
            local_1b8 = local_208.a1;
            fStack_1b4 = fVar36;
            fStack_1b0 = fVar37;
            fStack_1ac = fVar38;
            ConvertModel((FBXConverter *)paVar21,local_1c0,ppaVar20[-1],&local_208);
            Document::GetConnectionsByDestinationSequenced
                      (&local_130,*(Document **)((paVar21->mName).data + 0x19c),
                       (pMVar17->super_Object).id,"Model");
            ppaVar28 = local_1a8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            if (local_130.
                super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_130.
                super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              std::
              for_each<__gnu_cxx::__normal_iterator<aiNode**,std::vector<aiNode*,std::allocator<aiNode*>>>,Assimp::FBX::Util::delete_fun<aiNode>>
                        (local_1a8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         local_1a8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                         super__Vector_impl_data._M_finish);
            }
            else if (local_1a8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                     super__Vector_impl_data._M_start !=
                     local_1a8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                     super__Vector_impl_data._M_finish) {
              paVar21 = paVar22;
              ppaVar26 = local_1a8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                         super__Vector_impl_data._M_start;
              fVar36 = local_1b8;
              fVar37 = fStack_1b4;
              fVar38 = fStack_1b0;
              fVar52 = fStack_1ac;
              fVar43 = local_208.d1;
              fVar41 = local_208.d2;
              fVar29 = local_208.d3;
              fVar49 = local_208.d4;
              fVar48 = local_208.c1;
              fVar60 = local_208.c2;
              fVar46 = local_208.c3;
              fVar47 = local_208.c4;
              fVar33 = local_208.a1;
              fVar39 = local_208.b3;
              fVar55 = local_208.a3;
              fVar56 = 0.0;
              fVar54 = local_208.b4;
              fVar53 = local_208.b2;
              fVar59 = local_208.a4;
              fVar32 = 0.0;
              fVar62 = local_208.a2;
              fVar63 = 0.0;
              fVar57 = local_208.b1;
              fVar30 = 0.0;
              fVar58 = 0.0;
              fVar31 = 0.0;
              do {
                paVar22 = *ppaVar26;
                if (paVar22 == (aiNode *)0x0) {
                  local_208.c2 = fVar60;
                  local_208.c1 = fVar48;
                  local_208.c4 = fVar47;
                  local_208.c3 = fVar46;
                  local_208.d2 = fVar41;
                  local_208.d1 = fVar43;
                  local_208.d4 = fVar49;
                  local_208.d3 = fVar29;
                  local_208.a1 = fVar33;
                  local_208.a2 = fVar62;
                  local_208.a3 = fVar55;
                  local_208.a4 = fVar59;
                  local_208.b1 = fVar57;
                  local_208.b2 = fVar53;
                  local_208.b3 = fVar39;
                  local_208.b4 = fVar54;
                  __assert_fail("postnode",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                                ,0x103,
                                "void Assimp::FBX::FBXConverter::ConvertNodes(uint64_t, aiNode &, const aiMatrix4x4 &)"
                               );
                }
                fVar34 = fVar36;
                fVar35 = fVar39;
                fVar40 = fVar43;
                fVar42 = fVar41;
                fVar50 = fVar29;
                fVar51 = fVar48;
                fVar44 = fVar60;
                fVar45 = fVar46;
                fVar61 = fVar53;
                fVar64 = fVar57;
                if (paVar21 != parent) {
                  paVar21->mNumChildren = 1;
                  local_1b8 = fVar36;
                  fStack_1b4 = fVar37;
                  fStack_1b0 = fVar38;
                  fStack_1ac = fVar52;
                  local_168 = fVar62;
                  fStack_164 = fVar63;
                  fStack_160 = fVar63;
                  fStack_15c = fVar63;
                  local_158 = fVar48;
                  fStack_154 = fVar60;
                  fStack_150 = fVar46;
                  fStack_14c = fVar47;
                  local_148 = fVar43;
                  fStack_144 = fVar41;
                  fStack_140 = fVar29;
                  fStack_13c = fVar49;
                  local_118 = fVar57;
                  fStack_114 = fVar53;
                  fStack_110 = fVar39;
                  fStack_10c = fVar54;
                  local_108 = fVar33;
                  fStack_104 = fVar62;
                  fStack_100 = fVar55;
                  fStack_fc = fVar59;
                  local_f8 = fVar57;
                  fStack_f4 = fVar30;
                  fStack_f0 = fVar58;
                  fStack_ec = fVar31;
                  local_e8 = fVar59;
                  fStack_e4 = fVar32;
                  fStack_e0 = fVar32;
                  fStack_dc = fVar32;
                  local_d8 = fVar53;
                  fStack_d4 = fVar30;
                  fStack_d0 = fVar30;
                  fStack_cc = fVar30;
                  local_c8 = fVar54;
                  fStack_c4 = fVar31;
                  fStack_c0 = fVar31;
                  fStack_bc = fVar31;
                  local_b8 = fVar55;
                  fStack_b4 = fVar32;
                  fStack_b0 = fVar56;
                  fStack_ac = fVar32;
                  local_a8 = fVar39;
                  fStack_a4 = fVar31;
                  fStack_a0 = fVar58;
                  fStack_9c = fVar31;
                  ppaVar20 = (aiNode **)operator_new__(8);
                  paVar21->mChildren = ppaVar20;
                  *ppaVar20 = paVar22;
                  fVar34 = local_1b8;
                  fVar35 = local_a8;
                  fVar40 = local_148;
                  fVar42 = fStack_144;
                  fVar50 = fStack_140;
                  fVar49 = fStack_13c;
                  fVar51 = local_158;
                  fVar44 = fStack_154;
                  fVar45 = fStack_150;
                  fVar47 = fStack_14c;
                  fVar55 = local_b8;
                  fVar54 = local_c8;
                  fVar61 = local_d8;
                  fVar59 = local_e8;
                  fVar62 = local_168;
                  fVar64 = local_f8;
                }
                paVar22->mParent = paVar21;
                fVar43 = (paVar22->mTransformation).a1;
                fVar41 = (paVar22->mTransformation).a2;
                fVar29 = (paVar22->mTransformation).a3;
                fVar33 = (paVar22->mTransformation).a4;
                fVar56 = (paVar22->mTransformation).b1;
                fVar32 = (paVar22->mTransformation).b2;
                fVar63 = (paVar22->mTransformation).b3;
                fVar30 = (paVar22->mTransformation).b4;
                fVar58 = (paVar22->mTransformation).c1;
                fVar31 = (paVar22->mTransformation).c2;
                fVar1 = (paVar22->mTransformation).c3;
                fVar2 = (paVar22->mTransformation).c4;
                fVar3 = (paVar22->mTransformation).d1;
                fVar4 = (paVar22->mTransformation).d2;
                fVar5 = (paVar22->mTransformation).d3;
                fVar6 = (paVar22->mTransformation).d4;
                fVar36 = fVar59 * fVar3 + fVar55 * fVar58 + fVar34 * fVar43 + fVar62 * fVar56;
                fVar37 = fVar59 * fVar4 + fVar55 * fVar31 + fVar34 * fVar41 + fVar62 * fVar32;
                fVar38 = fVar59 * fVar5 + fVar55 * fVar1 + fVar34 * fVar29 + fVar62 * fVar63;
                fVar52 = fVar59 * fVar6 + fVar55 * fVar2 + fVar34 * fVar33 + fVar62 * fVar30;
                fVar57 = fVar54 * fVar3 + fVar35 * fVar58 + fVar64 * fVar43 + fVar61 * fVar56;
                fVar53 = fVar54 * fVar4 + fVar35 * fVar31 + fVar64 * fVar41 + fVar61 * fVar32;
                fVar39 = fVar54 * fVar5 + fVar35 * fVar1 + fVar64 * fVar29 + fVar61 * fVar63;
                fVar54 = fVar54 * fVar6 + fVar35 * fVar2 + fVar64 * fVar33 + fVar61 * fVar30;
                fVar48 = fVar47 * fVar3 + fVar45 * fVar58 + fVar51 * fVar43 + fVar44 * fVar56;
                fVar60 = fVar47 * fVar4 + fVar45 * fVar31 + fVar51 * fVar41 + fVar44 * fVar32;
                fVar46 = fVar47 * fVar5 + fVar45 * fVar1 + fVar51 * fVar29 + fVar44 * fVar63;
                fVar47 = fVar47 * fVar6 + fVar45 * fVar2 + fVar51 * fVar33 + fVar44 * fVar30;
                fVar43 = fVar49 * fVar3 + fVar50 * fVar58 + fVar40 * fVar43 + fVar42 * fVar56;
                fVar41 = fVar49 * fVar4 + fVar50 * fVar31 + fVar40 * fVar41 + fVar42 * fVar32;
                fVar29 = fVar49 * fVar5 + fVar50 * fVar1 + fVar40 * fVar29 + fVar42 * fVar63;
                fVar49 = fVar49 * fVar6 + fVar50 * fVar2 + fVar40 * fVar33 + fVar42 * fVar30;
                ppaVar26 = ppaVar26 + 1;
                paVar21 = paVar22;
                fVar33 = fVar36;
                fVar55 = fVar38;
                fVar56 = fVar38;
                fVar59 = fVar52;
                fVar32 = fVar52;
                fVar62 = fVar37;
                fVar63 = fVar37;
                fVar30 = fVar53;
                fVar58 = fVar39;
                fVar31 = fVar54;
              } while (ppaVar26 != ppaVar28);
              local_208.c2 = fVar60;
              local_208.c1 = fVar48;
              local_208.c4 = fVar47;
              local_208.c3 = fVar46;
              local_208.d2 = fVar41;
              local_208.d1 = fVar43;
              local_208.d4 = fVar49;
              local_208.d3 = fVar29;
              paVar21 = local_190;
              local_208.a1 = fVar36;
              local_208.a2 = fVar37;
              local_208.a3 = fVar38;
              local_208.a4 = fVar52;
              local_208.b1 = fVar57;
              local_208.b2 = fVar53;
              local_208.b3 = fVar39;
              local_208.b4 = fVar54;
            }
            ConvertNodes((FBXConverter *)paVar21,(local_1c0->super_Object).id,paVar22,&local_208);
            ppCVar25 = local_90;
            lVar19 = **(long **)((paVar21->mName).data + 0x19c);
            if (*(char *)(lVar19 + 6) == '\x01') {
              ConvertLights((FBXConverter *)paVar21,local_1c0,&local_68);
              lVar19 = **(long **)((paVar21->mName).data + 0x19c);
            }
            if (*(char *)(lVar19 + 5) == '\x01') {
              ConvertCameras((FBXConverter *)paVar21,local_1c0,&local_68);
            }
            if (local_188.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_188.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<aiNode*,std::allocator<aiNode*>>::_M_realloc_insert<aiNode*const&>
                        ((vector<aiNode*,std::allocator<aiNode*>> *)&local_188,
                         (iterator)
                         local_188.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                         super__Vector_impl_data._M_finish,(aiNode **)local_228);
            }
            else {
              *local_188.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
               super__Vector_impl_data._M_finish = *(aiNode **)local_228;
              local_188.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_188.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            if ((undefined1  [8])ppaStack_220 != local_228) {
              ppaStack_220 = (aiNode **)local_228;
            }
            if ((aiNode *)
                local_130.
                super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                ._M_impl.super__Vector_impl_data._M_start != (aiNode *)0x0) {
              operator_delete(local_130.
                              super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p);
            }
          }
        }
      }
      ppCVar27 = ppCVar27 + 1;
    } while (ppCVar27 != ppCVar25);
  }
  ppaVar26 = local_188.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  ppaVar28 = local_188.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((long)local_188.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_188.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    uVar24 = (long)local_188.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_188.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    __n = -(ulong)(uVar24 >> 0x3d != 0) |
          (long)local_188.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_188.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    ppaVar20 = (aiNode **)operator_new__(__n);
    memset(ppaVar20,0,__n);
    parent->mChildren = ppaVar20;
    parent->mNumChildren = (uint)uVar24;
    do {
      paVar21 = *ppaVar28;
      *ppaVar28 = *ppaVar20;
      *ppaVar20 = paVar21;
      ppaVar28 = ppaVar28 + 1;
      ppaVar20 = ppaVar20 + 1;
    } while (ppaVar28 != ppaVar26);
  }
  if (local_1a8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a8.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_228 != (undefined1  [8])0x0) {
    operator_delete((void *)local_228);
  }
  if (local_188.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
      super__Vector_impl_data._M_start != (aiNode **)0x0) {
    operator_delete(local_188.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_80.
      super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.
                    super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void FBXConverter::ConvertNodes(uint64_t id, aiNode& parent, const aiMatrix4x4& parent_transform) {
            const std::vector<const Connection*>& conns = doc.GetConnectionsByDestinationSequenced(id, "Model");

            std::vector<aiNode*> nodes;
            nodes.reserve(conns.size());

            std::vector<aiNode*> nodes_chain;
            std::vector<aiNode*> post_nodes_chain;

            try {
                for (const Connection* con : conns) {

                    // ignore object-property links
                    if (con->PropertyName().length()) {
                        continue;
                    }

                    const Object* const object = con->SourceObject();
                    if (nullptr == object) {
                        FBXImporter::LogWarn("failed to convert source object for Model link");
                        continue;
                    }

                    const Model* const model = dynamic_cast<const Model*>(object);

                    if (nullptr != model) {
                        nodes_chain.clear();
                        post_nodes_chain.clear();

                        aiMatrix4x4 new_abs_transform = parent_transform;

                        std::string unique_name = MakeUniqueNodeName(model, parent);

                        // even though there is only a single input node, the design of
                        // assimp (or rather: the complicated transformation chain that
                        // is employed by fbx) means that we may need multiple aiNode's
                        // to represent a fbx node's transformation.
                        const bool need_additional_node = GenerateTransformationNodeChain(*model, unique_name, nodes_chain, post_nodes_chain);

                        ai_assert(nodes_chain.size());

                        if (need_additional_node) {
                            nodes_chain.push_back(new aiNode(unique_name));
                        }

                        //setup metadata on newest node
                        SetupNodeMetadata(*model, *nodes_chain.back());

                        // link all nodes in a row
                        aiNode* last_parent = &parent;
                        for (aiNode* prenode : nodes_chain) {
                            ai_assert(prenode);

                            if (last_parent != &parent) {
                                last_parent->mNumChildren = 1;
                                last_parent->mChildren = new aiNode*[1];
                                last_parent->mChildren[0] = prenode;
                            }

                            prenode->mParent = last_parent;
                            last_parent = prenode;

                            new_abs_transform *= prenode->mTransformation;
                        }

                        // attach geometry
                        ConvertModel(*model, *nodes_chain.back(), new_abs_transform);

                        // check if there will be any child nodes
                        const std::vector<const Connection*>& child_conns
                            = doc.GetConnectionsByDestinationSequenced(model->ID(), "Model");

                        // if so, link the geometric transform inverse nodes
                        // before we attach any child nodes
                        if (child_conns.size()) {
                            for (aiNode* postnode : post_nodes_chain) {
                                ai_assert(postnode);

                                if (last_parent != &parent) {
                                    last_parent->mNumChildren = 1;
                                    last_parent->mChildren = new aiNode*[1];
                                    last_parent->mChildren[0] = postnode;
                                }

                                postnode->mParent = last_parent;
                                last_parent = postnode;

                                new_abs_transform *= postnode->mTransformation;
                            }
                        }
                        else {
                            // free the nodes we allocated as we don't need them
                            Util::delete_fun<aiNode> deleter;
                            std::for_each(
                                post_nodes_chain.begin(),
                                post_nodes_chain.end(),
                                deleter
                            );
                        }

                        // attach sub-nodes (if any)
                        ConvertNodes(model->ID(), *last_parent, new_abs_transform);

                        if (doc.Settings().readLights) {
                            ConvertLights(*model, unique_name);
                        }

                        if (doc.Settings().readCameras) {
                            ConvertCameras(*model, unique_name);
                        }

                        nodes.push_back(nodes_chain.front());
                        nodes_chain.clear();
                    }
                }

                if (nodes.size()) {
                    parent.mChildren = new aiNode*[nodes.size()]();
                    parent.mNumChildren = static_cast<unsigned int>(nodes.size());

                    std::swap_ranges(nodes.begin(), nodes.end(), parent.mChildren);
                }
            }
            catch (std::exception&) {
                Util::delete_fun<aiNode> deleter;
                std::for_each(nodes.begin(), nodes.end(), deleter);
                std::for_each(nodes_chain.begin(), nodes_chain.end(), deleter);
                std::for_each(post_nodes_chain.begin(), post_nodes_chain.end(), deleter);
            }
        }